

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sAnalyzerSettings.cpp
# Opt level: O0

void __thiscall I2sAnalyzerSettings::I2sAnalyzerSettings(I2sAnalyzerSettings *this)

{
  AnalyzerSettingInterfaceChannel *pAVar1;
  element_type *peVar2;
  AnalyzerSettingInterfaceNumberList *pAVar3;
  element_type *peVar4;
  ulong uVar5;
  Channel *pCVar6;
  char *pcVar7;
  uint uVar8;
  uint local_12c;
  char local_128 [4];
  U32 i;
  char str [256];
  I2sAnalyzerSettings *this_local;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__I2sAnalyzerSettings_00116d68;
  Channel::Channel(&this->mClockChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  Channel::Channel(&this->mFrameChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  Channel::Channel(&this->mDataChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this->mShiftOrder = MsbFirst;
  this->mDataValidEdge = NegEdge;
  this->mBitsPerWord = 0x10;
  this->mWordAlignment = LEFT_ALIGNED;
  this->mFrameType = FRAME_TRANSITION_ONCE_EVERY_WORD;
  this->mBitAlignment = BITS_SHIFTED_RIGHT_1;
  this->mSigned = UnsignedInteger;
  this->mWordSelectInverted = WS_NOT_INVERTED;
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::auto_ptr
            (&this->mClockChannelInterface,(element_type *)0x0);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::auto_ptr
            (&this->mFrameChannelInterface,(element_type *)0x0);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::auto_ptr
            (&this->mDataChannelInterface,(element_type *)0x0);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::auto_ptr
            (&this->mShiftOrderInterface,(element_type *)0x0);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::auto_ptr
            (&this->mDataValidEdgeInterface,(element_type *)0x0);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::auto_ptr
            (&this->mBitsPerWordInterface,(element_type *)0x0);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::auto_ptr
            (&this->mFrameTypeInterface,(element_type *)0x0);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::auto_ptr
            (&this->mWordAlignmentInterface,(element_type *)0x0);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::auto_ptr
            (&this->mBitAlignmentInterface,(element_type *)0x0);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::auto_ptr
            (&this->mSignedInterface,(element_type *)0x0);
  uVar5 = 0;
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::auto_ptr
            (&this->mWordSelectInvertedInterface,(element_type *)0x0);
  pAVar1 = (AnalyzerSettingInterfaceChannel *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar5);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar1);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::reset(&this->mClockChannelInterface,pAVar1);
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mClockChannelInterface)
  ;
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar2,"CLOCK channel");
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mClockChannelInterface)
  ;
  pCVar6 = &this->mClockChannel;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)peVar2);
  pAVar1 = (AnalyzerSettingInterfaceChannel *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar6);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar1);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::reset(&this->mFrameChannelInterface,pAVar1);
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mFrameChannelInterface)
  ;
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar2,"FRAME");
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mFrameChannelInterface)
  ;
  pCVar6 = &this->mFrameChannel;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)peVar2);
  pAVar1 = (AnalyzerSettingInterfaceChannel *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar6);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar1);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::reset(&this->mDataChannelInterface,pAVar1);
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mDataChannelInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar2,"DATA");
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mDataChannelInterface);
  pCVar6 = &this->mDataChannel;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)peVar2);
  pAVar3 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar6);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar3);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(&this->mShiftOrderInterface,pAVar3);
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mShiftOrderInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar4,"DATA Significant Bit");
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mShiftOrderInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)peVar4,"Most Significant Bit Sent First");
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mShiftOrderInterface);
  pcVar7 = "Least Significant Bit Sent First";
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)peVar4,"Least Significant Bit Sent First");
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mShiftOrderInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mShiftOrder);
  pAVar3 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar7);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar3);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(&this->mDataValidEdgeInterface,pAVar3);
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mDataValidEdgeInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar4,"CLOCK State");
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mDataValidEdgeInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber(1.0,(char *)peVar4,"Falling edge");
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mDataValidEdgeInterface);
  pcVar7 = "Rising edge";
  AnalyzerSettingInterfaceNumberList::AddNumber(0.0,(char *)peVar4,"Rising edge");
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mDataValidEdgeInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mDataValidEdge);
  pAVar3 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar7);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar3);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(&this->mBitsPerWordInterface,pAVar3);
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mBitsPerWordInterface);
  pcVar7 = "Audio Bit Depth (bits/sample)";
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar4,"Audio Bit Depth (bits/sample)");
  for (local_12c = 2; local_12c < 0x41; local_12c = local_12c + 1) {
    pcVar7 = local_128;
    sprintf(pcVar7,"%d Bits/Word",(ulong)local_12c);
    peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                       (&this->mBitsPerWordInterface);
    AnalyzerSettingInterfaceNumberList::AddNumber((double)local_12c,(char *)peVar4,pcVar7);
  }
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mBitsPerWordInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mBitsPerWord);
  pAVar3 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar7);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar3);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(&this->mFrameTypeInterface,pAVar3);
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mFrameTypeInterface)
  ;
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar4,"FRAME Signal Transitions");
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mFrameTypeInterface)
  ;
  AnalyzerSettingInterfaceNumberList::AddNumber(0.0,(char *)peVar4,"Twice each word");
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mFrameTypeInterface)
  ;
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)peVar4,"Once each word (I2S, PCM standard)");
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mFrameTypeInterface)
  ;
  pcVar7 = "Twice every 4 words";
  AnalyzerSettingInterfaceNumberList::AddNumber(2.0,(char *)peVar4,"Twice every 4 words");
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mFrameTypeInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mFrameType);
  pAVar3 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar7);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar3);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(&this->mWordAlignmentInterface,pAVar3);
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mWordAlignmentInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar4,"DATA Bits Alignment");
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mWordAlignmentInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber(0.0,(char *)peVar4,"Left aligned");
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mWordAlignmentInterface);
  pcVar7 = "Right aligned";
  AnalyzerSettingInterfaceNumberList::AddNumber(1.0,(char *)peVar4,"Right aligned");
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mWordAlignmentInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mWordAlignment);
  pAVar3 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar7);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar3);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(&this->mBitAlignmentInterface,pAVar3);
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mBitAlignmentInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar4,"DATA Bits Shift");
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mBitAlignmentInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)peVar4,"Right-shifted by one (I2S typical)");
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mBitAlignmentInterface);
  pcVar7 = "No shift (PCM standard)";
  AnalyzerSettingInterfaceNumberList::AddNumber(1.0,(char *)peVar4,"No shift (PCM standard)");
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mBitAlignmentInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mBitAlignment);
  pAVar3 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar7);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar3);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(&this->mSignedInterface,pAVar3);
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mSignedInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar4,"Signed/Unsigned");
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mSignedInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber(0.0,(char *)peVar4,"Unsigned");
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mSignedInterface);
  pcVar7 = "Signed (two\'s complement)";
  AnalyzerSettingInterfaceNumberList::AddNumber(1.0,(char *)peVar4,"Signed (two\'s complement)");
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mSignedInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mSigned);
  pAVar3 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar7);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar3);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset
            (&this->mWordSelectInvertedInterface,pAVar3);
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mWordSelectInvertedInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar4,"Word Select High");
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mWordSelectInvertedInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)peVar4,"Channel 2 (right - I2S typical)");
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mWordSelectInvertedInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber(0.0,(char *)peVar4,"Channel 1 (left - inverted)");
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mWordSelectInvertedInterface)
  ;
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mWordSelectInverted);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::get(&this->mClockChannelInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::get(&this->mFrameChannelInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::get(&this->mDataChannelInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::get(&this->mShiftOrderInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::get(&this->mDataValidEdgeInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::get(&this->mBitsPerWordInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::get(&this->mFrameTypeInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::get(&this->mWordAlignmentInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::get(&this->mBitAlignmentInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::get(&this->mSignedInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::get(&this->mWordSelectInvertedInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar8 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar8,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar8,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar8,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mClockChannel,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mFrameChannel,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mDataChannel,true);
  return;
}

Assistant:

I2sAnalyzerSettings::I2sAnalyzerSettings()
    : mClockChannel( UNDEFINED_CHANNEL ),
      mFrameChannel( UNDEFINED_CHANNEL ),
      mDataChannel( UNDEFINED_CHANNEL ),

      mShiftOrder( AnalyzerEnums::MsbFirst ),
      mDataValidEdge( AnalyzerEnums::NegEdge ),
      mBitsPerWord( 16 ),

      mWordAlignment( LEFT_ALIGNED ),
      mFrameType( FRAME_TRANSITION_ONCE_EVERY_WORD ),
      mBitAlignment( BITS_SHIFTED_RIGHT_1 ),
      mSigned( AnalyzerEnums::UnsignedInteger ),
      mWordSelectInverted( WS_NOT_INVERTED )
{
    mClockChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mClockChannelInterface->SetTitleAndTooltip( "CLOCK channel", "Clock, aka I2S SCK - Continuous Serial Clock, aka Bit Clock" );
    mClockChannelInterface->SetChannel( mClockChannel );

    mFrameChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mFrameChannelInterface->SetTitleAndTooltip( "FRAME", "Frame Delimiter / aka I2S WS - Word Select, aka Sampling Clock" );
    mFrameChannelInterface->SetChannel( mFrameChannel );

    mDataChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mDataChannelInterface->SetTitleAndTooltip( "DATA", "Data, aka I2S SD - Serial Data" );
    mDataChannelInterface->SetChannel( mDataChannel );


    mShiftOrderInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mShiftOrderInterface->SetTitleAndTooltip( "DATA Significant Bit",
                                              "Select if the most significant bit or least significant bit is transmitted first" );
    mShiftOrderInterface->AddNumber( AnalyzerEnums::MsbFirst, "Most Significant Bit Sent First", "" );
    mShiftOrderInterface->AddNumber( AnalyzerEnums::LsbFirst, "Least Significant Bit Sent First", "" );
    mShiftOrderInterface->SetNumber( mShiftOrder );

    mDataValidEdgeInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mDataValidEdgeInterface->SetTitleAndTooltip( "CLOCK State",
                                                 "Specify if data is valid (should be read) on the rising, or falling clock edge." );
    mDataValidEdgeInterface->AddNumber( AnalyzerEnums::NegEdge, "Falling edge", "" );
    mDataValidEdgeInterface->AddNumber( AnalyzerEnums::PosEdge, "Rising edge", "" );
    mDataValidEdgeInterface->SetNumber( mDataValidEdge );

    mBitsPerWordInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mBitsPerWordInterface->SetTitleAndTooltip( "Audio Bit Depth (bits/sample)",
                                               "Specify the number of audio bits/word.  Any additional bits will be ignored" );
    char str[ 256 ];
    for( U32 i = 2; i <= 64; i++ )
    {
        sprintf( str, "%d Bits/Word", i );
        mBitsPerWordInterface->AddNumber( i, str, "" );
    }
    mBitsPerWordInterface->SetNumber( mBitsPerWord );


    // enum PcmFrameType { FRAME_TRANSITION_TWICE_EVERY_WORD, FRAME_TRANSITION_ONCE_EVERY_WORD, FRAME_TRANSITION_TWICE_EVERY_FOUR_WORDS };
    mFrameTypeInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mFrameTypeInterface->SetTitleAndTooltip( "FRAME Signal Transitions", "Specify the type of frame signal used." );
    mFrameTypeInterface->AddNumber( FRAME_TRANSITION_TWICE_EVERY_WORD, "Twice each word", "" );
    mFrameTypeInterface->AddNumber( FRAME_TRANSITION_ONCE_EVERY_WORD, "Once each word (I2S, PCM standard)", "" );
    mFrameTypeInterface->AddNumber( FRAME_TRANSITION_TWICE_EVERY_FOUR_WORDS, "Twice every 4 words", "" );
    mFrameTypeInterface->SetNumber( mFrameType );

    mWordAlignmentInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mWordAlignmentInterface->SetTitleAndTooltip( "DATA Bits Alignment",
                                                 "Specify whether data bits are left or right aligned with respect to FRAME edges. Only "
                                                 "needed if more bits are sent than needed each frame, and additional bits are ignored." );
    mWordAlignmentInterface->AddNumber( LEFT_ALIGNED, "Left aligned", "" );
    mWordAlignmentInterface->AddNumber( RIGHT_ALIGNED, "Right aligned", "" );
    mWordAlignmentInterface->SetNumber( mWordAlignment );

    // enum PcmBitAlignment { FIRST_FRAME_BIT_BELONGS_TO_PREVIOUS_WORD, FIRST_FRAME_BIT_BELONGS_TO_CURRENT_WORD };
    mBitAlignmentInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mBitAlignmentInterface->SetTitleAndTooltip( "DATA Bits Shift", "Specify the bit shift with respect to the FRAME edges" );
    mBitAlignmentInterface->AddNumber( BITS_SHIFTED_RIGHT_1, "Right-shifted by one (I2S typical)", "" );
    mBitAlignmentInterface->AddNumber( NO_SHIFT, "No shift (PCM standard)", "" );
    mBitAlignmentInterface->SetNumber( mBitAlignment );

    mSignedInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mSignedInterface->SetTitleAndTooltip(
        "Signed/Unsigned", "Select whether samples are unsigned or signed values (only shows up if the display type is decimal)" );
    mSignedInterface->AddNumber( AnalyzerEnums::UnsignedInteger, "Unsigned", "Interpret samples as unsigned integers" );
    mSignedInterface->AddNumber( AnalyzerEnums::SignedInteger, "Signed (two's complement)",
                                 "Interpret samples as signed integers -- only when display type is set to decimal" );
    mSignedInterface->SetNumber( mSigned );


    mWordSelectInvertedInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mWordSelectInvertedInterface->SetTitleAndTooltip( "Word Select High", "Select whether Word Select high is channel 1 or channel 2" );
    mWordSelectInvertedInterface->AddNumber( WS_NOT_INVERTED, "Channel 2 (right - I2S typical)",
                                             "when word select (FRAME) is logic 1, data is channel 2." );
    mWordSelectInvertedInterface->AddNumber( WS_INVERTED, "Channel 1 (left - inverted)",
                                             "when word select (FRAME) is logic 1, data is channel 1." );
    mWordSelectInvertedInterface->SetNumber( mWordSelectInverted );

    AddInterface( mClockChannelInterface.get() );
    AddInterface( mFrameChannelInterface.get() );
    AddInterface( mDataChannelInterface.get() );
    AddInterface( mShiftOrderInterface.get() );
    AddInterface( mDataValidEdgeInterface.get() );
    AddInterface( mBitsPerWordInterface.get() );
    AddInterface( mFrameTypeInterface.get() );
    AddInterface( mWordAlignmentInterface.get() );
    AddInterface( mBitAlignmentInterface.get() );
    AddInterface( mSignedInterface.get() );
    AddInterface( mWordSelectInvertedInterface.get() );

    // AddExportOption( 0, "Export as text/csv file", "text (*.txt);;csv (*.csv)" );
    AddExportOption( 0, "Export as text/csv file" );
    AddExportExtension( 0, "text", "txt" );
    AddExportExtension( 0, "csv", "csv" );

    ClearChannels();
    AddChannel( mClockChannel, "PCM CLOCK", false );
    AddChannel( mFrameChannel, "PCM FRAME", false );
    AddChannel( mDataChannel, "PCM DATA", false );
}